

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::TabBarAddTab(ImGuiTabBar *tab_bar,ImGuiTabItemFlags tab_flags,ImGuiWindow *window)

{
  ImGuiTabItem *pIVar1;
  ImGuiID IVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  ImGuiTabItem *in_RAX;
  ImGuiTabItem *pIVar6;
  ImGuiTabItem *pIVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  bool bVar13;
  
  IVar2 = window->ID;
  if (IVar2 != 0) {
    uVar9 = (ulong)(tab_bar->Tabs).Size;
    bVar13 = 0 < (long)uVar9;
    if (0 < (long)uVar9) {
      in_RAX = (tab_bar->Tabs).Data;
      bVar13 = true;
      if (in_RAX->ID != IVar2) {
        pIVar7 = in_RAX + (uVar9 - 1);
        pIVar6 = in_RAX;
        uVar5 = 1;
        do {
          uVar11 = uVar5;
          in_RAX = pIVar7;
          if (uVar9 == uVar11) break;
          in_RAX = pIVar6 + 1;
          pIVar1 = pIVar6 + 1;
          pIVar6 = in_RAX;
          uVar5 = uVar11 + 1;
        } while (pIVar1->ID != IVar2);
        bVar13 = uVar11 < uVar9;
      }
    }
    if (bVar13) goto LAB_00183e9f;
  }
  in_RAX = (ImGuiTabItem *)0x0;
LAB_00183e9f:
  if (in_RAX != (ImGuiTabItem *)0x0) {
    __assert_fail("TabBarFindTabByID(tab_bar, window->ID) == __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_widgets.cpp"
                  ,0x1da5,
                  "void ImGui::TabBarAddTab(ImGuiTabBar *, ImGuiTabItemFlags, ImGuiWindow *)");
  }
  if (GImGui->CurrentTabBar == tab_bar) {
    __assert_fail("g.CurrentTabBar != tab_bar",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_widgets.cpp"
                  ,0x1da6,
                  "void ImGui::TabBarAddTab(ImGuiTabBar *, ImGuiTabItemFlags, ImGuiWindow *)");
  }
  iVar12 = tab_bar->CurrFrameVisible;
  if (iVar12 == -1) {
    iVar12 = GImGui->FrameCount + -1;
  }
  bVar13 = window->HasCloseButton;
  iVar10 = (tab_bar->Tabs).Size;
  iVar3 = (tab_bar->Tabs).Capacity;
  if (iVar10 == iVar3) {
    iVar10 = iVar10 + 1;
    if (iVar3 == 0) {
      iVar8 = 8;
    }
    else {
      iVar8 = iVar3 / 2 + iVar3;
    }
    if (iVar10 < iVar8) {
      iVar10 = iVar8;
    }
    if (iVar3 < iVar10) {
      pIVar7 = (ImGuiTabItem *)MemAlloc((long)iVar10 * 0x30);
      pIVar6 = (tab_bar->Tabs).Data;
      if (pIVar6 != (ImGuiTabItem *)0x0) {
        memcpy(pIVar7,pIVar6,(long)(tab_bar->Tabs).Size * 0x30);
        MemFree((tab_bar->Tabs).Data);
      }
      (tab_bar->Tabs).Data = pIVar7;
      (tab_bar->Tabs).Capacity = iVar10;
    }
  }
  uVar4 = tab_flags | 0x100000;
  if (bVar13 != false) {
    uVar4 = tab_flags;
  }
  pIVar6 = (tab_bar->Tabs).Data;
  iVar10 = (tab_bar->Tabs).Size;
  pIVar6[iVar10].ID = IVar2;
  pIVar6[iVar10].Flags = uVar4;
  pIVar6[iVar10].Window = window;
  pIVar6[iVar10].LastFrameVisible = iVar12;
  pIVar6[iVar10].LastFrameSelected = -1;
  pIVar6[iVar10].ContentWidth = 0.0;
  pIVar6[iVar10].Offset = 0.0;
  pIVar6[iVar10].Width = 0.0;
  pIVar7 = pIVar6 + iVar10;
  pIVar7->NameOffset = -1;
  pIVar7->BeginOrder = -1;
  pIVar7->IndexDuringLayout = -1;
  *(undefined4 *)&pIVar6[iVar10].WantClose = 0;
  (tab_bar->Tabs).Size = (tab_bar->Tabs).Size + 1;
  return;
}

Assistant:

void ImGui::TabBarAddTab(ImGuiTabBar* tab_bar, ImGuiTabItemFlags tab_flags, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(TabBarFindTabByID(tab_bar, window->ID) == NULL);
    IM_ASSERT(g.CurrentTabBar != tab_bar);  // Can't work while the tab bar is active as our tab doesn't have an X offset yet, in theory we could/should test something like (tab_bar->CurrFrameVisible < g.FrameCount) but we'd need to solve why triggers the commented early-out assert in BeginTabBarEx() (probably dock node going from implicit to explicit in same frame)

    if (!window->HasCloseButton)
        tab_flags |= ImGuiTabItemFlags_NoCloseButton;       // Set _NoCloseButton immediately because it will be used for first-frame width calculation.

    ImGuiTabItem new_tab;
    new_tab.ID = window->ID;
    new_tab.Flags = tab_flags;
    new_tab.LastFrameVisible = tab_bar->CurrFrameVisible;   // Required so BeginTabBar() doesn't ditch the tab
    if (new_tab.LastFrameVisible == -1)
        new_tab.LastFrameVisible = g.FrameCount - 1;
    new_tab.Window = window;                                // Required so tab bar layout can compute the tab width before tab submission
    tab_bar->Tabs.push_back(new_tab);
}